

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_clone(secp256k1_context *ctx)

{
  int iVar1;
  secp256k1_callback *cb;
  secp256k1_context *ctx_00;
  size_t prealloc_size;
  secp256k1_context *ret;
  secp256k1_context *in_stack_ffffffffffffffd8;
  secp256k1_callback *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  iVar1 = secp256k1_context_is_proper((secp256k1_context *)0x10aae23);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_ffffffffffffffe0,(char *)in_stack_ffffffffffffffd8);
    local_8 = (secp256k1_context *)0x0;
  }
  else {
    cb = (secp256k1_callback *)secp256k1_context_preallocated_clone_size(in_stack_ffffffffffffffd8);
    ctx_00 = (secp256k1_context *)checked_malloc(cb,(size_t)in_stack_ffffffffffffffd8);
    local_8 = secp256k1_context_preallocated_clone(ctx_00,cb);
  }
  return local_8;
}

Assistant:

secp256k1_context* secp256k1_context_clone(const secp256k1_context* ctx) {
    secp256k1_context* ret;
    size_t prealloc_size;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    prealloc_size = secp256k1_context_preallocated_clone_size(ctx);
    ret = (secp256k1_context*)checked_malloc(&ctx->error_callback, prealloc_size);
    ret = secp256k1_context_preallocated_clone(ctx, ret);
    return ret;
}